

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  _Rb_tree_node_base *p_Var1;
  string *this;
  pointer *ppuVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr *pp_Var4;
  ulong uVar5;
  Export *pEVar6;
  long lVar7;
  pointer puVar8;
  undefined1 auVar9 [8];
  size_t wasm_00;
  bool bVar10;
  char cVar11;
  bool bVar12;
  uint64_t uVar13;
  ostream *poVar14;
  istream *piVar15;
  _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *this_00;
  _Base_ptr p_Var16;
  size_type sVar17;
  uint *keepFuncs_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  long lVar19;
  char *pcVar20;
  size_t *psVar21;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  *__x;
  size_t t_1;
  ulong uVar22;
  pointer puVar23;
  ulong uVar24;
  iterator __begin2;
  const_iterator __begin2_2;
  string *psVar25;
  Name NVar26;
  Name NVar27;
  Name NVar28;
  Name NVar29;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>,_bool>
  pVar30;
  Name name;
  Name name_00;
  Name name_01;
  Name name_02;
  Name name_03;
  undefined1 local_f30 [8];
  WasmSplitOptions options;
  Module wasm;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> keepFuncs_1;
  undefined1 local_498 [272];
  undefined1 auStack_388 [8];
  Config config;
  string local_1f8;
  undefined1 local_1d8 [8];
  anon_class_8_1_38e0b97e printFnSet;
  undefined8 local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  undefined1 local_148 [8];
  uint64_t moduleHash;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138 [2];
  undefined1 local_118 [8];
  string line;
  undefined1 auStack_e8 [8];
  Results splitResults;
  undefined1 local_a0 [8];
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> splitFuncs;
  set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> keepFuncs;
  
  ::wasm::WasmSplitOptions::WasmSplitOptions((WasmSplitOptions *)local_f30);
  ::wasm::WasmSplitOptions::parse((WasmSplitOptions *)local_f30,argc,argv);
  bVar10 = ::wasm::WasmSplitOptions::validate((WasmSplitOptions *)local_f30);
  if (!bVar10) {
    ::wasm::Fatal::Fatal
              ((Fatal *)&options.usedOptions.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::wasm::Fatal::operator<<
              ((Fatal *)&options.usedOptions.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (char (*) [31])"Invalid command line arguments");
LAB_001181b4:
    ::wasm::Fatal::~Fatal
              ((Fatal *)&options.usedOptions.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  keepFuncs_00 = &switchD_00116a25::switchdataD_00128004;
  switch(options.super_ToolOptions.enabledFeatures.features) {
  case 0:
    ::wasm::Module::Module
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown.dwarf_3ea68::parseInput
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(WasmSplitOptions *)local_f30);
    puVar8 = wasm.functions.
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&keepFuncs;
    keepFuncs._M_t._M_impl._0_4_ = 0;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs;
    splitFuncs._M_t._M_impl._0_4_ = 0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (options.profileFile._M_dataplus._M_p == (pointer)0x0) {
      puVar23 = wasm.exports.
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      if (((char)options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count == '\x01') &&
         ((options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ & 1) == 0)) {
        for (; puVar23 != (pointer)puVar8; puVar23 = puVar23 + 1) {
          pEVar6 = (puVar23->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          if (*(long *)((long)&(pEVar6->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8)
              == 0) {
            std::
            _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
            ::_M_insert_unique<wasm::Name_const&>
                      ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                        *)local_a0,&pEVar6->name);
          }
        }
      }
      else {
        for (; puVar23 != (pointer)puVar8; puVar23 = puVar23 + 1) {
          pEVar6 = (puVar23->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          if (*(long *)((long)&(pEVar6->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8)
              == 0) {
            std::
            _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
            ::_M_insert_unique<wasm::Name_const&>
                      ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                        *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,&pEVar6->name
                      );
          }
        }
      }
    }
    else {
      uVar13 = anon_unknown.dwarf_3ea68::hashFile((string *)options._560_8_);
      keepFuncs_00 = (uint *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      anon_unknown.dwarf_3ea68::getFunctionsToKeepAndSplit
                ((Module *)
                 &options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar13,
                 (string *)&options.usePlaceholders,
                 (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)keepFuncs_00
                 ,(set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)local_a0);
    }
    for (p_Var16 = options.keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var16 != (_Base_ptr)&options.keepFuncs;
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
      NVar28.super_IString.str._M_str = *(char **)(p_Var16 + 1);
      NVar28.super_IString.str._M_len =
           (size_t)&options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar19 = ::wasm::Module::getFunctionOrNull(NVar28);
      if (lVar19 == 0) {
        if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0')
        {
          poVar14 = std::operator<<((ostream *)&std::cerr,"warning: function ");
          name.super_IString.str._M_str = (char *)keepFuncs_00;
          name.super_IString.str._M_len = (size_t)p_Var16[1]._M_parent;
          poVar14 = ::wasm::operator<<((wasm *)poVar14,*(ostream **)(p_Var16 + 1),name);
          std::operator<<(poVar14," does not exist\n");
        }
      }
      else {
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (Name *)(p_Var16 + 1));
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::erase((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_a0,(key_type *)(p_Var16 + 1));
      }
    }
    for (p_Var16 = options.splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var16 != (_Base_ptr)&options.splitFuncs;
        p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
      NVar29.super_IString.str._M_str = *(char **)(p_Var16 + 1);
      NVar29.super_IString.str._M_len =
           (size_t)&options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
      lVar19 = ::wasm::Module::getFunctionOrNull(NVar29);
      if (lVar19 == 0) {
        if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0')
        {
          poVar14 = std::operator<<((ostream *)&std::cerr,"warning: function ");
          name_01.super_IString.str._M_str = (char *)keepFuncs_00;
          name_01.super_IString.str._M_len = (size_t)p_Var16[1]._M_parent;
          poVar14 = ::wasm::operator<<((wasm *)poVar14,*(ostream **)(p_Var16 + 1),name_01);
          pcVar20 = " does not exist\n";
LAB_0011774b:
          std::operator<<(poVar14,pcVar20);
        }
      }
      else if (*(long *)(lVar19 + 0x20) == 0) {
        p_Var1 = p_Var16 + 1;
        if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0')
           && (sVar17 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::
                        count((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *
                              )((long)&options.profileExport.field_2 + 8),(key_type *)p_Var1),
              sVar17 != 0)) {
          poVar14 = std::operator<<((ostream *)&std::cerr,"warning: function ");
          name_02.super_IString.str._M_str = (char *)keepFuncs_00;
          name_02.super_IString.str._M_len = (size_t)p_Var16[1]._M_parent;
          poVar14 = ::wasm::operator<<((wasm *)poVar14,*(ostream **)(p_Var16 + 1),name_02);
          std::operator<<(poVar14," was to be both kept and split. It will be split.\n");
        }
        std::
        _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
        ::_M_insert_unique<wasm::Name_const&>
                  ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                    *)local_a0,(Name *)p_Var1);
        std::
        _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
        ::erase((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,(key_type *)p_Var1);
      }
      else if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket ==
               '\0') {
        poVar14 = std::operator<<((ostream *)&std::cerr,
                                  "warning: cannot split out imported function ");
        name_00.super_IString.str._M_str = (char *)keepFuncs_00;
        name_00.super_IString.str._M_len = (size_t)p_Var16[1]._M_parent;
        poVar14 = ::wasm::operator<<((wasm *)poVar14,*(ostream **)(p_Var16 + 1),name_00);
        pcVar20 = "\n";
        goto LAB_0011774b;
      }
    }
    if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0') &&
       (keepFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)) {
      std::operator<<((ostream *)&std::cerr,
                      "warning: not keeping any functions in the primary module\n");
    }
    if (options.storageKind._2_1_ == 1) {
      std::
      _Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
      ::_M_insert_unique<wasm::Name_const&>
                ((_Rb_tree<wasm::Name,wasm::Name,std::_Identity<wasm::Name>,std::less<wasm::Name>,std::allocator<wasm::Name>>
                  *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (Name *)::wasm::ModuleSplitting::LOAD_SECONDARY_MODULE);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::erase((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)local_a0,(key_type *)::wasm::ModuleSplitting::LOAD_SECONDARY_MODULE);
    }
    if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket == '\0') &&
       (splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right == (_Base_ptr)0x0)) {
      std::operator<<((ostream *)&std::cerr,
                      "warning: not splitting any functions out to the secondary module\n");
    }
    if (options.mode._2_1_ == 1) {
      std::operator<<((ostream *)&std::cout,"Keeping functions: ");
      psVar21 = &splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)local_148,
                 (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)psVar21);
      (anonymous_namespace)::splitModule(wasm::WasmSplitOptions_const&)::$_0::operator()
                ((__0 *)local_148,
                 (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)psVar21);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_148);
      std::operator<<((ostream *)&std::cout,"\n");
      std::operator<<((ostream *)&std::cout,"Splitting out functions: ");
      __x = (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
             *)local_a0;
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                  *)local_118,__x);
      (anonymous_namespace)::splitModule(wasm::WasmSplitOptions_const&)::$_0::operator()
                ((__0 *)local_118,
                 (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)__x);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)local_118);
      std::operator<<((ostream *)&std::cout,"\n");
    }
    for (puVar23 = wasm.exports.
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        puVar23 !=
        (pointer)wasm.functions.
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar23 = puVar23 + 1) {
      pEVar6 = (puVar23->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (((*(long *)((long)&(pEVar6->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 8) ==
            0) && (sVar17 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                            ::count((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                                     *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    &pEVar6->name), sVar17 == 0)) &&
         (sVar17 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::count
                             ((set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *
                              )local_a0,&pEVar6->name), sVar17 == 0)) {
        __assert_fail("keepFuncs.count(func->name) || splitFuncs.count(func->name)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/wasm-split.cpp"
                      ,0x13c,
                      "auto (anonymous namespace)::splitModule(const WasmSplitOptions &)::(anonymous class)::operator()(Function *) const"
                     );
      }
    }
    ::wasm::ModuleSplitting::Config::Config((Config *)auStack_388);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::operator=((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_388,
                (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_a0);
    if (options.importNamespace._M_dataplus._M_p != (pointer)0x0) {
      ::wasm::IString::IString
                ((IString *)&wasm.tagsMap._M_h._M_single_bucket,
                 (string *)((long)&options.secondaryOutput.field_2 + 8));
      config._48_8_ = wasm.tagsMap._M_h._M_single_bucket;
    }
    if (options.placeholderNamespace._M_dataplus._M_p != (pointer)0x0) {
      ::wasm::IString::IString
                ((IString *)&wasm.tagsMap._M_h._M_single_bucket,
                 (string *)((long)&options.importNamespace.field_2 + 8));
      config.importNamespace.super_IString.str._M_str = (char *)wasm.tagsMap._M_h._M_single_bucket;
    }
    if (options.exportPrefix._M_dataplus._M_p != (pointer)0x0) {
      std::__cxx11::string::_M_assign
                ((string *)&config.placeholderNamespace.super_IString.str._M_str);
    }
    pcVar20 = (char *)CONCAT71((int7)((ulong)keepFuncs_00 >> 8),(undefined1)options.mode);
    config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ =
         (undefined1)options.mode;
    config.newExportPrefix.field_2._M_local_buf[8] =
         options.super_ToolOptions.passOptions.inlining.partialInliningIfs._2_1_ ^ 1;
    config.newExportPrefix.field_2._M_local_buf[9] = options.storageKind._2_1_;
    ::wasm::ModuleSplitting::splitFunctions
              ((Module *)auStack_e8,
               (Config *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown.dwarf_3ea68::adjustTableSize
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,options.outPrefix.field_2._8_4_,
               false);
    anon_unknown.dwarf_3ea68::adjustTableSize
              ((Module *)auStack_e8,options.outPrefix.field_2._8_4_,true);
    if ((undefined1)options.storageKind == InMemory) {
      std::operator+(&local_1a8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&options.output.field_2 + 8),".symbols");
      anon_unknown.dwarf_3ea68::writeSymbolMap
                ((Module *)
                 &options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      auVar9 = auStack_e8;
      std::operator+(&local_1f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&options.primaryOutput.field_2 + 8),".symbols");
      anon_unknown.dwarf_3ea68::writeSymbolMap((Module *)auVar9,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    if (options.storageKind._1_1_ == 1) {
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
      ::_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                  *)local_1d8,
                 (_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                  *)&splitResults);
      std::operator+(&local_188,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&options.output.field_2 + 8),".placeholders");
      ::wasm::Output::Output
                ((Output *)&wasm.tagsMap._M_h._M_single_bucket,(string *)&local_188,Text);
      for (; (_Rb_tree_node_base *)local_1c0 != (_Rb_tree_node_base *)&printFnSet;
          local_1c0 = std::_Rb_tree_increment((_Rb_tree_node_base *)local_1c0)) {
        poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)local_498);
        poVar14 = std::operator<<(poVar14,':');
        name_03.super_IString.str._M_str = pcVar20;
        name_03.super_IString.str._M_len =
             (size_t)((_Rb_tree_node_base *)(local_1c0 + 0x20))->_M_left;
        poVar14 = ::wasm::operator<<((wasm *)poVar14,
                                     (ostream *)
                                     ((_Rb_tree_node_base *)(local_1c0 + 0x20))->_M_parent,name_03);
        std::operator<<(poVar14,'\n');
      }
      ::wasm::Output::~Output((Output *)&wasm.tagsMap._M_h._M_single_bucket);
      std::__cxx11::string::~string((string *)&local_188);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
      ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_wasm::Name>,_std::_Select1st<std::pair<const_unsigned_long,_wasm::Name>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wasm::Name>_>_>
                   *)local_1d8);
    }
    if (options.storageKind._3_1_ == 1) {
      if (wasm.name.super_IString.str._M_len == 0) {
        ::wasm::Path::getBaseName((string *)&wasm.tagsMap._M_h._M_single_bucket);
        ::wasm::IString::IString
                  ((IString *)&local_168,(string *)&wasm.tagsMap._M_h._M_single_bucket);
        wasm._376_8_ = local_168._M_dataplus._M_p;
        wasm.name.super_IString.str._M_len = local_168._M_string_length;
        std::__cxx11::string::~string((string *)&wasm.tagsMap._M_h._M_single_bucket);
      }
      ::wasm::Path::getBaseName((string *)&wasm.tagsMap._M_h._M_single_bucket);
      ::wasm::IString::IString((IString *)&local_168,(string *)&wasm.tagsMap._M_h._M_single_bucket);
      (((Name *)((long)auStack_e8 + 0x180))->super_IString).str._M_len =
           (size_t)local_168._M_dataplus._M_p;
      (((Name *)((long)auStack_e8 + 0x180))->super_IString).str._M_str =
           (char *)local_168._M_string_length;
      std::__cxx11::string::~string((string *)&wasm.tagsMap._M_h._M_single_bucket);
    }
    std::__cxx11::string::string
              ((string *)&wasm.tagsMap._M_h._M_single_bucket,
               (string *)(options.output.field_2._M_local_buf + 8));
    anon_unknown.dwarf_3ea68::writeModule
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)&wasm.tagsMap._M_h._M_single_bucket,(WasmSplitOptions *)local_f30);
    std::__cxx11::string::~string((string *)&wasm.tagsMap._M_h._M_single_bucket);
    auVar9 = auStack_e8;
    std::__cxx11::string::string
              ((string *)&local_168,(string *)(options.primaryOutput.field_2._M_local_buf + 8));
    anon_unknown.dwarf_3ea68::writeModule((Module *)auVar9,&local_168,(WasmSplitOptions *)local_f30)
    ;
    std::__cxx11::string::~string((string *)&local_168);
    ::wasm::ModuleSplitting::Results::~Results((Results *)auStack_e8);
    ::wasm::ModuleSplitting::Config::~Config((Config *)auStack_388);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)local_a0);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    goto LAB_00117cc3;
  case 1:
    if (options.manifestFile._M_dataplus._M_p == (pointer)0x0) {
      ::wasm::Fatal::Fatal
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::wasm::Fatal::operator<<
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [34])"--multi-split requires --manifest");
    }
    else if (options.output._M_dataplus._M_p == (pointer)0x0) {
      ::wasm::Fatal::Fatal
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::wasm::Fatal::operator<<
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char (*) [32])"--multi-split requires --output");
    }
    else {
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (options.exportPrefix.field_2._M_local_buf + 8);
      std::ifstream::ifstream(&wasm.tagsMap._M_h._M_single_bucket,(string *)pbVar18,_S_in);
      cVar11 = std::__basic_file<char>::is_open();
      if (cVar11 != '\0') {
        ::wasm::Module::Module
                  ((Module *)
                   &options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        anon_unknown.dwarf_3ea68::parseInput
                  ((Module *)
                   &options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,(WasmSplitOptions *)local_f30
                  );
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&splitFuncs;
        splitFuncs._M_t._M_impl._0_4_ = 0;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
        local_148 = (undefined1  [8])local_138;
        moduleHash = 0;
        this_00 = (_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)0x0;
        local_138[0]._M_local_buf[0] = '\0';
        auStack_e8 = (undefined1  [8])
                     &splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header.
                      _M_right;
        splitResults.secondary._M_t.
        super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
        super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
             (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
             (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)0x1;
        splitResults.placeholderMap._M_t._M_impl._0_8_ = 0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
             0x3f800000;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)0x0;
        splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0x0;
        local_118 = (undefined1  [8])&line._M_string_length;
        line._M_dataplus._M_p = (pointer)0x0;
        line._M_string_length._0_1_ = 0;
        bVar10 = true;
        splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        while (piVar15 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)&wasm.tagsMap._M_h._M_single_bucket,
                                    (string *)local_118),
              ((byte)piVar15[*(long *)(*(long *)piVar15 + -0x18) + 0x20] & 5) == 0) {
          if (line._M_dataplus._M_p == (pointer)0x0) {
            bVar10 = true;
          }
          else if (bVar10) {
            std::__cxx11::string::_M_assign((string *)local_148);
            bVar10 = false;
            this_00 = (_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                                       *)local_a0,(value_type *)local_118);
          }
          else {
            if (this_00 ==
                (_Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)0x0) {
              __assert_fail("currFuncs",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-split/wasm-split.cpp"
                            ,0x194,
                            "void (anonymous namespace)::multiSplitModule(const WasmSplitOptions &)"
                           );
            }
            std::__detail::
            _Insert_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::insert(this_00,(value_type *)local_118);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                      ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)auStack_388,(value_type *)local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_148);
            pVar30 = std::
                     _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                     ::_M_emplace<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                               ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                 *)auStack_e8,
                                (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)auStack_388);
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)auStack_388);
            if (((undefined1  [16])pVar30 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)pVar30.first.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                               ._M_cur.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        + 0x28);
              bVar12 = std::operator!=(pbVar18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)local_148);
              if (bVar12) {
                ::wasm::Fatal::Fatal((Fatal *)auStack_388);
                p_Var3 = &config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header;
                std::operator<<((ostream *)p_Var3,"Function ");
                std::operator<<((ostream *)p_Var3,(string *)local_118);
                std::operator<<((ostream *)p_Var3,"cannot be assigned to module ");
                std::operator<<((ostream *)p_Var3,(string *)local_148);
                std::operator<<((ostream *)p_Var3,"; it is already assigned to module ");
                std::operator<<((ostream *)p_Var3,(string *)pbVar18);
                splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     CONCAT71(splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,10);
                ::wasm::Fatal::operator<<
                          ((Fatal *)auStack_388,
                           (char *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
                ::wasm::Fatal::~Fatal((Fatal *)auStack_388);
              }
            }
            else if ((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket
                     == '\0') {
              ::wasm::IString::IString((IString *)&local_188,(value_type *)local_118);
              NVar27.super_IString.str._M_str = local_188._M_dataplus._M_p;
              NVar27.super_IString.str._M_len =
                   (size_t)&options.usedOptions.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage;
              lVar19 = ::wasm::Module::getFunctionOrNull(NVar27);
              if (lVar19 == 0) {
                poVar14 = std::operator<<((ostream *)&std::cerr,"warning: Function ");
                poVar14 = std::operator<<(poVar14,(string *)local_118);
                std::operator<<(poVar14," does not exist\n");
              }
            }
          }
        }
        ::wasm::ModuleSplitting::Config::Config((Config *)auStack_388);
        config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = Split;
        ::wasm::Name::Name((Name *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,"");
        config._48_8_ = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
        config.newExportPrefix.field_2._M_local_buf[8] = '\x01';
        for (p_Var16 = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var16 != (_Rb_tree_node_base *)&splitFuncs;
            p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16)) {
          p_Var1 = p_Var16 + 1;
          if (options.mode._2_1_ == 1) {
            poVar14 = std::operator<<((ostream *)&std::cerr,"Splitting module ");
            poVar14 = std::operator<<(poVar14,(string *)p_Var1);
            std::operator<<(poVar14,'\n');
          }
          if (((char)options.super_ToolOptions.passOptions.passesToSkip._M_h._M_single_bucket ==
               '\0') && (p_Var16[2]._M_right == (_Base_ptr)0x0)) {
            poVar14 = std::operator<<((ostream *)&std::cerr,"warning: Module ");
            poVar14 = std::operator<<(poVar14,(string *)p_Var1);
            std::operator<<(poVar14," will be empty\n");
          }
          psVar21 = &splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>>::
          set<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
                    ((set<wasm::Name,std::less<wasm::Name>,std::allocator<wasm::Name>> *)psVar21,
                     (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                      )p_Var16[2]._M_left,
                     (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                      )0x0);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::operator=((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)auStack_388,
                      (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)psVar21);
          std::
          _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
          ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                       *)psVar21);
          ::wasm::ModuleSplitting::splitFunctions
                    ((Module *)psVar21,
                     (Config *)
                     &options.usedOptions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          std::operator+(&local_1a8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&options.manifestFile.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var1
                        );
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1d8,&local_1a8,".wasm");
          std::__cxx11::string::~string((string *)&local_1a8);
          wasm_00 = splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
          std::__cxx11::string::string((string *)&local_1f8,(string *)local_1d8);
          anon_unknown.dwarf_3ea68::writeModule
                    ((Module *)wasm_00,&local_1f8,(WasmSplitOptions *)local_f30);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)local_1d8);
          ::wasm::ModuleSplitting::Results::~Results
                    ((Results *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        std::__cxx11::string::string
                  ((string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (string *)
                   &options.inputFiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        anon_unknown.dwarf_3ea68::writeModule
                  ((Module *)
                   &options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (WasmSplitOptions *)local_f30);
        std::__cxx11::string::~string
                  ((string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        ::wasm::ModuleSplitting::Config::~Config((Config *)auStack_388);
        std::__cxx11::string::~string((string *)local_118);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)auStack_e8);
        std::__cxx11::string::~string((string *)local_148);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                     *)local_a0);
        ::wasm::Module::~Module
                  ((Module *)
                   &options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::ifstream::~ifstream(&wasm.tagsMap._M_h._M_single_bucket);
        break;
      }
      ::wasm::Fatal::Fatal
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::operator<<((ostream *)
                      &wasm.exports.
                       super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,"File not found: ");
      ::wasm::Fatal::operator<<
                ((Fatal *)&options.usedOptions.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,pbVar18);
    }
    goto LAB_001181b4;
  case 2:
    ::wasm::Module::Module
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown.dwarf_3ea68::parseInput
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(WasmSplitOptions *)local_f30);
    psVar25 = (string *)(options.profileFile.field_2._M_local_buf + 8);
    ::wasm::IString::IString((IString *)local_a0,psVar25);
    NVar26.super_IString.str._M_str = (char *)local_a0;
    NVar26.super_IString.str._M_len =
         (size_t)&options.usedOptions.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    lVar19 = ::wasm::Module::getExportOrNull(NVar26);
    if (lVar19 != 0) {
      ::wasm::Fatal::Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
      p_Var3 = &keepFuncs_1._M_t._M_impl.super__Rb_tree_header;
      std::operator<<((ostream *)p_Var3,"error: Export ");
      std::operator<<((ostream *)p_Var3,(string *)psVar25);
      ::wasm::Fatal::operator<<
                ((Fatal *)&wasm.tagsMap._M_h._M_single_bucket,(char (*) [17])" already exists.");
      ::wasm::Fatal::~Fatal((Fatal *)&wasm.tagsMap._M_h._M_single_bucket);
    }
    local_148 = (undefined1  [8])anon_unknown.dwarf_3ea68::hashFile((string *)options._560_8_);
    ::wasm::InstrumenterConfig::InstrumenterConfig((InstrumenterConfig *)auStack_e8);
    if (options.importNamespace._M_dataplus._M_p != (pointer)0x0) {
      ::wasm::IString::IString
                ((IString *)&wasm.tagsMap._M_h._M_single_bucket,
                 (string *)((long)&options.secondaryOutput.field_2 + 8));
      splitResults.secondary._M_t.
      super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl._4_4_ =
           keepFuncs_1._M_t._M_impl._4_4_;
      splitResults.secondary._M_t.
      super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
      super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl._0_4_ =
           keepFuncs_1._M_t._M_impl._0_4_;
      auStack_e8 = (undefined1  [8])wasm.tagsMap._M_h._M_single_bucket;
    }
    if (options.secondaryMemoryName._M_dataplus._M_p != (pointer)0x0) {
      ::wasm::IString::IString
                ((IString *)&wasm.tagsMap._M_h._M_single_bucket,
                 (string *)((long)&options.placeholderNamespace.field_2 + 8));
      splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ =
           keepFuncs_1._M_t._M_impl._4_4_;
      splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           keepFuncs_1._M_t._M_impl._0_4_;
      splitResults.placeholderMap._M_t._M_impl._0_8_ = wasm.tagsMap._M_h._M_single_bucket;
    }
    this = (string *)
           &splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    splitResults.placeholderMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_4_ =
         options.super_ToolOptions.disabledFeatures.features;
    std::__cxx11::string::_M_assign(this);
    ::wasm::PassOptions::PassOptions
              ((PassOptions *)auStack_388,(PassOptions *)&options.super_ToolOptions.field_0xb0);
    ::wasm::PassRunner::PassRunner
              ((PassRunner *)&wasm.tagsMap._M_h._M_single_bucket,
               (Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(PassOptions *)auStack_388);
    ::wasm::PassOptions::~PassOptions((PassOptions *)auStack_388);
    std::make_unique<wasm::Instrumenter,wasm::InstrumenterConfig&,unsigned_long&>
              ((InstrumenterConfig *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (unsigned_long *)auStack_e8);
    local_118 = (undefined1  [8])splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count;
    splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    ::wasm::PassRunner::add
              ((PassRunner *)&wasm.tagsMap._M_h._M_single_bucket,
               (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)local_118);
    if (local_118 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_118 + 8))();
    }
    local_118 = (undefined1  [8])0x0;
    if (splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      (**(code **)(*(long *)splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count + 8))();
    }
    ::wasm::PassRunner::run();
    anon_unknown.dwarf_3ea68::adjustTableSize
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,options.outPrefix.field_2._8_4_,
               false);
    std::__cxx11::string::string
              ((string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (string *)
               &options.inputFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown.dwarf_3ea68::writeModule
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (WasmSplitOptions *)local_f30);
    std::__cxx11::string::~string
              ((string *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ::wasm::PassRunner::~PassRunner((PassRunner *)&wasm.tagsMap._M_h._M_single_bucket);
    std::__cxx11::string::~string(this);
LAB_00117cc3:
    ::wasm::Module::~Module
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    break;
  case 3:
    anon_unknown.dwarf_3ea68::readProfile
              ((ProfileData *)&wasm.tagsMap._M_h._M_single_bucket,(string *)options._560_8_);
    splitResults.placeholderMap._M_t._M_impl._0_8_ = 0;
    auStack_e8 = (undefined1  [8])0x0;
    splitResults.secondary._M_t.
    super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
    super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Module,_std::default_delete<wasm::Module>,_true,_true>)
         (__uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>)0x0;
    if (options.mode._2_1_ == 1) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_e8,
                 keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                 CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) >> 3);
      for (lVar19 = 0;
          keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
          CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) >> 3 != lVar19;
          lVar19 = lVar19 + 1) {
        if (*(long *)(CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) +
                     lVar19 * 8) != 0) {
          *(_Base_ptr *)((long)auStack_e8 + lVar19 * 8) = (_Base_ptr)0x1;
        }
      }
    }
    for (uVar24 = 1;
        uVar24 < (ulong)((long)options.inputFiles.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start - options._560_8_ >> 5);
        uVar24 = uVar24 + 1) {
      lVar19 = uVar24 * 0x20;
      anon_unknown.dwarf_3ea68::readProfile
                ((ProfileData *)auStack_388,(string *)(options._560_8_ + lVar19));
      if (auStack_388 != (undefined1  [8])wasm.tagsMap._M_h._M_single_bucket) {
        ::wasm::Fatal::Fatal
                  ((Fatal *)&options.usedOptions.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ppuVar2 = &wasm.exports.
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        std::operator<<((ostream *)ppuVar2,"Checksum in profile ");
        std::operator<<((ostream *)ppuVar2,(string *)(lVar19 + options._560_8_));
        std::operator<<((ostream *)ppuVar2," does not match hash in profile ");
        ::wasm::Fatal::operator<<
                  ((Fatal *)&options.usedOptions.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   options._560_8_);
        goto LAB_001181b4;
      }
      lVar7 = CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_);
      if (config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
          config.secondaryFuncs._M_t._M_impl._0_8_ !=
          keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - lVar7) {
        ::wasm::Fatal::Fatal
                  ((Fatal *)&options.usedOptions.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        ppuVar2 = &wasm.exports.
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        std::operator<<((ostream *)ppuVar2,"Profile ");
        std::operator<<((ostream *)ppuVar2,(string *)(lVar19 + options._560_8_));
        std::operator<<((ostream *)ppuVar2," incompatible with profile ");
        ::wasm::Fatal::operator<<
                  ((Fatal *)&options.usedOptions.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   options._560_8_);
        goto LAB_001181b4;
      }
      for (lVar19 = 0;
          keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ - lVar7 >> 3 != lVar19;
          lVar19 = lVar19 + 1) {
        uVar5 = *(ulong *)(lVar7 + lVar19 * 8);
        uVar22 = *(ulong *)(config.secondaryFuncs._M_t._M_impl._0_8_ + lVar19 * 8);
        if (uVar5 == 0) {
          if (uVar22 != 0) goto LAB_00117210;
        }
        else if (uVar22 != 0) {
          if (uVar5 <= uVar22) {
            uVar22 = uVar5;
          }
LAB_00117210:
          *(ulong *)(lVar7 + lVar19 * 8) = uVar22;
        }
        if (((options.mode._2_1_ & 1) != Split >> 0x10) &&
           (*(long *)(config.secondaryFuncs._M_t._M_impl._0_8_ + lVar19 * 8) != 0)) {
          pp_Var4 = (_Base_ptr *)
                    (&(((vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                         *)auStack_e8)->
                      super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar19);
          *pp_Var4 = (_Base_ptr)((long)&(*pp_Var4)->_M_color + 1);
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&config);
    }
    if (options.mode._2_1_ == 1) {
      for (psVar25 = (string *)options._560_8_;
          psVar25 !=
          options.inputFiles.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start; psVar25 = psVar25 + 1) {
        anon_unknown.dwarf_3ea68::readProfile
                  ((ProfileData *)
                   &options.usedOptions.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,psVar25);
        for (lVar19 = 0;
            (long)wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)wasm.exports.
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3 != lVar19; lVar19 = lVar19 + 1) {
          if ((wasm.exports.
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar19]._M_t.
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl != (Export *)0x0) &&
             (*(_Base_ptr *)((long)auStack_e8 + lVar19 * 8) == (_Base_ptr)0x1)) goto LAB_001172cb;
        }
        poVar14 = std::operator<<((ostream *)&std::cout,"Profile ");
        poVar14 = std::operator<<(poVar14,(string *)psVar25);
        std::operator<<(poVar14," only includes functions included in other profiles.\n");
LAB_001172cb:
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&wasm);
      }
    }
    auStack_388 = (undefined1  [8])0x0;
    config.secondaryFuncs._M_t._M_impl._0_8_ = 0;
    config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    ::wasm::BufferWithRandomAccess::operator<<
              ((BufferWithRandomAccess *)auStack_388,(int64_t)wasm.tagsMap._M_h._M_single_bucket);
    for (uVar24 = 0;
        uVar24 < (ulong)(keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ -
                         CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) >>
                        3); uVar24 = uVar24 + 1) {
      ::wasm::BufferWithRandomAccess::operator<<
                ((BufferWithRandomAccess *)auStack_388,
                 *(int32_t *)
                  (CONCAT44(keepFuncs_1._M_t._M_impl._4_4_,keepFuncs_1._M_t._M_impl._0_4_) +
                  uVar24 * 8));
    }
    ::wasm::Output::Output
              ((Output *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)
               &options.inputFiles.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,Binary);
    ::wasm::BufferWithRandomAccess::writeTo<std::ostream>
              ((BufferWithRandomAccess *)auStack_388,
               (basic_ostream<char,_std::char_traits<char>_> *)
               &wasm.typeIndices._M_h._M_single_bucket);
    ::wasm::Output::~Output
              ((Output *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_388);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_e8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&keepFuncs_1);
    break;
  case 4:
    std::__cxx11::string::string((string *)local_a0,(string *)options._560_8_);
    anon_unknown.dwarf_3ea68::checkExists((string *)&options.usePlaceholders);
    anon_unknown.dwarf_3ea68::checkExists((string *)local_a0);
    ::wasm::Module::Module
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    anon_unknown.dwarf_3ea68::parseInput
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(WasmSplitOptions *)local_f30);
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&keepFuncs_1;
    keepFuncs_1._M_t._M_impl._0_4_ = 0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&config;
    config.secondaryFuncs._M_t._M_impl._0_8_ =
         (ulong)(uint)config.secondaryFuncs._M_t._M_impl._4_4_ << 0x20;
    config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         keepFuncs_1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         config.secondaryFuncs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    uVar13 = anon_unknown.dwarf_3ea68::hashFile((string *)local_a0);
    anon_unknown.dwarf_3ea68::getFunctionsToKeepAndSplit
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar13,
               (string *)&options.usePlaceholders,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
               &wasm.tagsMap._M_h._M_single_bucket,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)auStack_388);
    local_1d8 = (undefined1  [8])local_f30;
    poVar14 = std::operator<<((ostream *)&std::cout,"Keeping functions: ");
    std::endl<char,std::char_traits<char>>(poVar14);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)auStack_e8,
               (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&wasm.tagsMap._M_h._M_single_bucket);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_148,"+",
               (allocator<char> *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    (anonymous_namespace)::printReadableProfile(wasm::WasmSplitOptions_const&)::$_0::operator()
              (local_1d8,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)auStack_e8,
               (string *)local_148);
    std::__cxx11::string::~string((string *)local_148);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_e8);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar14 = std::operator<<((ostream *)&std::cout,"Splitting out functions: ");
    std::endl<char,std::char_traits<char>>(poVar14);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                *)auStack_388);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_118,"-",(allocator<char> *)&local_1a8);
    (anonymous_namespace)::printReadableProfile(wasm::WasmSplitOptions_const&)::$_0::operator()
              (local_1d8,
               (set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
               &splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)local_118);
    std::__cxx11::string::~string((string *)local_118);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&splitFuncs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)auStack_388);
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                 *)&wasm.tagsMap._M_h._M_single_bucket);
    ::wasm::Module::~Module
              ((Module *)
               &options.usedOptions.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_a0);
  }
  ::wasm::WasmSplitOptions::~WasmSplitOptions((WasmSplitOptions *)local_f30);
  return 0;
}

Assistant:

int main(int argc, const char* argv[]) {
  WasmSplitOptions options;
  options.parse(argc, argv);

  if (!options.validate()) {
    Fatal() << "Invalid command line arguments";
  }

  switch (options.mode) {
    case WasmSplitOptions::Mode::Split:
      splitModule(options);
      break;
    case WasmSplitOptions::Mode::MultiSplit:
      multiSplitModule(options);
      break;
    case WasmSplitOptions::Mode::Instrument:
      instrumentModule(options);
      break;
    case WasmSplitOptions::Mode::MergeProfiles:
      mergeProfiles(options);
      break;
    case WasmSplitOptions::Mode::PrintProfile:
      printReadableProfile(options);
      break;
  }
}